

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprSimplifiedAndOr(Expr *pExpr)

{
  Expr *local_30;
  Expr *local_28;
  Expr *pLeft;
  Expr *pRight;
  Expr *pExpr_local;
  
  pRight = pExpr;
  if ((pExpr->op == ',') || (pExpr->op == '+')) {
    local_30 = sqlite3ExprSimplifiedAndOr(pExpr->pRight);
    local_28 = sqlite3ExprSimplifiedAndOr(pExpr->pLeft);
    if (((local_28->flags & 0x10000001) == 0x10000000) ||
       ((local_30->flags & 0x20000001) == 0x20000000)) {
      if (pExpr->op == ',') {
        local_28 = local_30;
      }
      pRight = local_28;
    }
    else if (((local_30->flags & 0x10000001) == 0x10000000) ||
            ((local_28->flags & 0x20000001) == 0x20000000)) {
      if (pExpr->op == ',') {
        local_30 = local_28;
      }
      pRight = local_30;
    }
  }
  return pRight;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSimplifiedAndOr(Expr *pExpr){
  assert( pExpr!=0 );
  if( pExpr->op==TK_AND || pExpr->op==TK_OR ){
    Expr *pRight = sqlite3ExprSimplifiedAndOr(pExpr->pRight);
    Expr *pLeft = sqlite3ExprSimplifiedAndOr(pExpr->pLeft);
    if( ExprAlwaysTrue(pLeft) || ExprAlwaysFalse(pRight) ){
      pExpr = pExpr->op==TK_AND ? pRight : pLeft;
    }else if( ExprAlwaysTrue(pRight) || ExprAlwaysFalse(pLeft) ){
      pExpr = pExpr->op==TK_AND ? pLeft : pRight;
    }
  }
  return pExpr;
}